

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O1

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *
gimage::operator/=(Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,double s)

{
  int iVar1;
  long lVar2;
  long lVar3;
  unsigned_short ***pppuVar4;
  unsigned_short *puVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  iVar1 = image->depth;
  if (0 < (long)iVar1) {
    lVar2 = image->width;
    lVar3 = image->height;
    lVar7 = 0;
    do {
      if (0 < lVar3) {
        pppuVar4 = image->img;
        lVar8 = 0;
        do {
          if (0 < lVar2) {
            puVar5 = pppuVar4[lVar7][lVar8];
            lVar9 = 0;
            do {
              iVar6 = (int)((double)puVar5[lVar9] / s);
              if (0xfffe < iVar6) {
                iVar6 = 0xffff;
              }
              if (iVar6 < 1) {
                iVar6 = 0;
              }
              puVar5[lVar9] = (unsigned_short)iVar6;
              lVar9 = lVar9 + 1;
            } while (lVar2 != lVar9);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar3);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return image;
}

Assistant:

Image<T> &operator/=(Image<T> &image, double s)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=0;

        v=image.get(i, k, d);

        if (image.isValidS(v))
        {
          image.setLimited(i, k, d, static_cast<typename Image<T>::work_t>(v/s));
        }
      }
    }
  }

  return image;
}